

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_FieldCppStringType_Test::
FeaturesTest_FieldCppStringType_Test(FeaturesTest_FieldCppStringType_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018dcc90;
  return;
}

Assistant:

TEST_F(FeaturesTest, FieldCppStringType) {
  BuildDescriptorMessagesInTestPool();
  const std::string file_contents = absl::Substitute(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2024
        message_type {
          name: "Foo"
          field {
            name: "view"
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_STRING
          }
          field {
            name: "str"
            number: 2
            label: LABEL_OPTIONAL
            type: TYPE_STRING
            options {
              features {
                [pb.cpp] { string_type: STRING }
              }
            }
          }
          field {
            name: "cord"
            number: 3
            label: LABEL_OPTIONAL
            type: TYPE_STRING
            options {
              features {
                [pb.cpp] { string_type: CORD }
              }
            }
          }
          field {
            name: "cord_bytes"
            number: 4
            label: LABEL_OPTIONAL
            type: TYPE_BYTES
            options {
              features {
                [pb.cpp] { string_type: CORD }
              }
            }
          } $0
          extension_range { start: 100 end: 200 }
        }
        extension {
          name: "cord_ext"
          number: 100
          label: LABEL_OPTIONAL
          type: TYPE_STRING
          options {
            features {
              [pb.cpp] { string_type: CORD }
            }
          }
          extendee: "Foo"
        }
      )pb",
      ""
  );
  const FileDescriptor* file = BuildFile(file_contents);
  const Descriptor* message = file->message_type(0);
  const FieldDescriptor* view = message->field(0);
  const FieldDescriptor* str = message->field(1);
  const FieldDescriptor* cord = message->field(2);
  const FieldDescriptor* cord_bytes = message->field(3);
  const FieldDescriptor* cord_ext = file->extension(0);

  EXPECT_EQ(view->cpp_string_type(), FieldDescriptor::CppStringType::kView);
  EXPECT_EQ(str->cpp_string_type(), FieldDescriptor::CppStringType::kString);
  EXPECT_EQ(cord_bytes->cpp_string_type(),
            FieldDescriptor::CppStringType::kCord);
  EXPECT_EQ(cord->cpp_string_type(), FieldDescriptor::CppStringType::kString);
  EXPECT_EQ(cord_ext->cpp_string_type(),
            FieldDescriptor::CppStringType::kString);

}